

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O1

bool __thiscall
Clasp::SolveAlgorithm::attach(SolveAlgorithm *this,SharedContext *ctx,ModelHandler *onModel)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  Enumerator *pEVar4;
  Enumerator *pEVar5;
  double dVar6;
  
  if (this->ctx_ != (SharedContext *)0x0) {
    Potassco::fail(-2,"bool Clasp::SolveAlgorithm::attach(SharedContext &, ModelHandler *)",0x11c,
                   "!ctx_","SolveAlgorithm is already running!",0);
  }
  if (((ctx->share_).field_0x3 & 2) == 0) {
    SharedContext::endInit(ctx,false);
  }
  SharedContext::report(ctx,subsystem_solve);
  if (((((*(ctx->solvers_).ebo_.buf)->conflict_).ebo_.size == 0) && ((this->limits_).conflicts != 0)
      ) && (iVar3 = (*this->_vptr_SolveAlgorithm[2])(this), (char)iVar3 == '\0')) {
    this->ctx_ = ctx;
    dVar6 = ThreadTime::getTime();
    this->time_ = dVar6;
    this->onModel_ = onModel;
    this->last_ = 0;
    SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::reset(&this->core_,(pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0);
    if (1 < (this->enum_).ptr_) {
      return true;
    }
    pEVar4 = EnumOptions::nullEnumerator();
    uVar1 = (this->enum_).ptr_;
    pEVar5 = (Enumerator *)(uVar1 & 0xfffffffffffffffe);
    if (((uVar1 & 1) != 0 && pEVar4 != pEVar5) &&
       ((this->enum_).ptr_ = (uintp)pEVar5, pEVar5 != (Enumerator *)0x0)) {
      (*pEVar5->_vptr_Enumerator[1])();
    }
    (this->enum_).ptr_ = (ulong)pEVar4 | 1;
    return true;
  }
  bVar2 = SharedContext::ok(ctx);
  this->last_ = (uint)!bVar2 * 2;
  return false;
}

Assistant:

bool SolveAlgorithm::attach(SharedContext& ctx, ModelHandler* onModel) {
	POTASSCO_REQUIRE(!ctx_, "SolveAlgorithm is already running!");
	if (!ctx.frozen()) { ctx.endInit(); }
	ctx.report(Event::subsystem_solve);
	if (ctx.master()->hasConflict() || !limits_.conflicts || interrupted()) {
		last_  = !ctx.ok() ? value_false : value_free;
		return false;
	}
	ctx_     = &ctx;
	time_    = ThreadTime::getTime();
	onModel_ = onModel;
	last_    = value_free;
	core_.reset(0);
	if (!enum_.get()) { enum_ = EnumOptions::nullEnumerator(); }
	return true;
}